

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O0

FormInfo * AddFormInfo(char *value,char *contenttype,FormInfo *parent_form_info)

{
  FormInfo *form_info;
  FormInfo *parent_form_info_local;
  char *contenttype_local;
  char *value_local;
  
  value_local = (char *)(*Curl_ccalloc)(1,0x80);
  if ((FormInfo *)value_local == (FormInfo *)0x0) {
    value_local = (char *)0x0;
  }
  else {
    if (value != (char *)0x0) {
      ((FormInfo *)value_local)->value = value;
    }
    if (contenttype != (char *)0x0) {
      ((FormInfo *)value_local)->contenttype = contenttype;
    }
    ((FormInfo *)value_local)->flags = 1;
    if (parent_form_info != (FormInfo *)0x0) {
      ((FormInfo *)value_local)->more = parent_form_info->more;
      parent_form_info->more = (FormInfo *)value_local;
    }
  }
  return (FormInfo *)value_local;
}

Assistant:

static FormInfo * AddFormInfo(char *value,
                              char *contenttype,
                              FormInfo *parent_form_info)
{
  FormInfo *form_info;
  form_info = calloc(1, sizeof(struct FormInfo));
  if(form_info) {
    if(value)
      form_info->value = value;
    if(contenttype)
      form_info->contenttype = contenttype;
    form_info->flags = HTTPPOST_FILENAME;
  }
  else
    return NULL;

  if(parent_form_info) {
    /* now, point our 'more' to the original 'more' */
    form_info->more = parent_form_info->more;

    /* then move the original 'more' to point to ourselves */
    parent_form_info->more = form_info;
  }

  return form_info;
}